

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  Status SVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  cpp_dec_float<200U,_int,_void> *in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  int *in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  int *in_stack_00000018;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000020;
  int in_stack_0000015c;
  int *in_stack_00000160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000168;
  int *in_stack_00000170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000178;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000180;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff9c8;
  cpp_dec_float<200U,_int,_void> *f;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff9d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffac8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffad0;
  int local_3bc;
  int local_3b8;
  undefined4 local_334;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  int *in_stack_fffffffffffffdc0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdc8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdd0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pCVar5;
  int local_218;
  int local_214;
  int *local_110;
  cpp_dec_float<200U,_int,_void> *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *eps_00;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff30;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff38;
  
  local_110 = in_R9;
  local_f8 = in_RDX;
  eps_00 = in_RDI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  vSolveLright(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20,eps_00);
  if (in_stack_00000010 == 0) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff9d0);
    lVar3 = *(long *)(in_RDI[5].m_backend.data._M_elems + 6);
    local_3bc = 0;
    for (local_3b8 = 0; local_3b8 < in_stack_00000008; local_3b8 = local_3b8 + 1) {
      iVar2 = local_110[local_3b8];
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      if (bVar4) {
        enQueueMax(local_110,&local_3bc,*(int *)(lVar3 + (long)iVar2 * 4));
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_fffffffffffff9d0,(long_long_type)in_stack_fffffffffffff9c8);
      }
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff9d0);
    lVar3 = *(long *)(in_RDI[5].m_backend.data._M_elems + 6);
    local_218 = 0;
    in_stack_fffffffffffffdd0 = in_stack_00000020;
    for (local_214 = 0; local_214 < in_stack_00000008; local_214 = local_214 + 1) {
      SVar1 = local_110[local_214];
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      if (bVar4) {
        pCVar5 = (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&in_stack_fffffffffffffdd0->thedim;
        in_stack_fffffffffffffdd0->stat = SVar1;
        enQueueMax(local_110,&local_218,*(int *)(lVar3 + (long)(int)SVar1 * 4));
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      }
      else {
        local_334 = 0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_fffffffffffff9d0,(long_long_type)in_stack_fffffffffffff9c8);
        pCVar5 = in_stack_fffffffffffffdd0;
      }
      in_stack_fffffffffffffdd0 = pCVar5;
    }
    *in_stack_00000018 = local_218;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  f = (cpp_dec_float<200U,_int,_void> *)&stack0xfffffffffffffab4;
  in_stack_00000008 =
       vSolveUright(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
                    in_stack_00000160,in_stack_0000015c,_j);
  if (in_RDI[5].m_backend.fpclass == cpp_dec_float_finite) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(local_f8,f);
    in_stack_00000008 =
         vSolveUpdateRight(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                           in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                           in_stack_fffffffffffffdb0);
  }
  return in_stack_00000008;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}